

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O0

lzma_filter_encoder * encoder_find(lzma_vli id)

{
  ulong local_20;
  size_t i;
  lzma_vli id_local;
  
  local_20 = 0;
  while( true ) {
    if (8 < local_20) {
      return (lzma_filter_encoder *)0x0;
    }
    if (encoders[local_20].id == id) break;
    local_20 = local_20 + 1;
  }
  return encoders + local_20;
}

Assistant:

static const lzma_filter_encoder *
encoder_find(lzma_vli id)
{
	for (size_t i = 0; i < ARRAY_SIZE(encoders); ++i)
		if (encoders[i].id == id)
			return encoders + i;

	return NULL;
}